

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O0

void sLUWorkFree(int *iwork,float *dwork,GlobalLU_t *Glu)

{
  GlobalLU_t *Glu_local;
  float *dwork_local;
  int *iwork_local;
  
  if (Glu->MemModel == SYSTEM) {
    superlu_free(iwork);
    superlu_free(dwork);
  }
  else {
    (Glu->stack).used = (Glu->stack).used - ((Glu->stack).size - (Glu->stack).top2);
    (Glu->stack).top2 = (Glu->stack).size;
  }
  superlu_free(Glu->expanders);
  Glu->expanders = (ExpHeader *)0x0;
  return;
}

Assistant:

void sLUWorkFree(int *iwork, float *dwork, GlobalLU_t *Glu)
{
    if ( Glu->MemModel == SYSTEM ) {
	SUPERLU_FREE (iwork);
	SUPERLU_FREE (dwork);
    } else {
	Glu->stack.used -= (Glu->stack.size - Glu->stack.top2);
	Glu->stack.top2 = Glu->stack.size;
/*	sStackCompress(Glu);  */
    }
    
    SUPERLU_FREE (Glu->expanders);	
    Glu->expanders = NULL;
}